

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Endpoints.cpp
# Opt level: O1

void __thiscall
helics::Endpoint::sendTo(Endpoint *this,char *data,size_t data_size,string_view dest)

{
  _func_int *p_Var1;
  Core *pCVar2;
  InvalidFunctionCall *this_00;
  size_type sVar3;
  pointer pcVar4;
  string_view message;
  
  pcVar4 = dest._M_str;
  sVar3 = dest._M_len;
  if ((this->fed->_vptr_MessageFederate[-3][(long)&(this->fed->mfManager)._M_t] != (_func_int)0x2)
     && (p_Var1 = this->fed->_vptr_MessageFederate[-3],
        p_Var1[(long)&(this->fed->mfManager)._M_t] != (_func_int)0x1)) {
    this_00 = (InvalidFunctionCall *)
              __cxa_allocate_exception(0x28,p_Var1,data,data_size,sVar3,pcVar4);
    message._M_str = "messages not allowed outside of execution and initialization mode";
    message._M_len = 0x41;
    InvalidFunctionCall::InvalidFunctionCall(this_00,message);
    __cxa_throw(this_00,&InvalidFunctionCall::typeinfo,HelicsException::~HelicsException);
  }
  if (sVar3 == 0) {
    sVar3 = (this->defDest)._M_string_length;
    pcVar4 = (this->defDest)._M_dataplus._M_p;
  }
  pCVar2 = (this->super_Interface).mCore;
  (*pCVar2->_vptr_Core[0x4b])
            (pCVar2,(ulong)(uint)(this->super_Interface).handle.hid,data,data_size,sVar3,pcVar4);
  return;
}

Assistant:

void Endpoint::sendTo(const char* data, size_t data_size, std::string_view dest) const
{
    if ((fed->getCurrentMode() == Federate::Modes::EXECUTING) ||
        (fed->getCurrentMode() == Federate::Modes::INITIALIZING)) {
        if (dest.empty()) {
            dest = defDest;
        }
        mCore->sendTo(handle, data, data_size, dest);
    } else {
        throw(InvalidFunctionCall(
            "messages not allowed outside of execution and initialization mode"));
    }
}